

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_9,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Vector<float,_3> local_80;
  tcu local_70 [12];
  Vector<float,_3> local_64;
  VecAccess<float,_4,_3> local_58;
  Mat3 local_3c;
  
  getInputValue<2,9>(&local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  local_80.m_data[2] = (evalCtx->coords).m_data[2];
  local_80.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  tcu::operator*(local_70,&local_3c,&local_80);
  tcu::Vector<float,_3>::Vector(&local_64,(Vector<float,_3> *)local_70);
  local_58.m_vector = &evalCtx->color;
  local_58.m_index[0] = 0;
  local_58.m_index[1] = 1;
  local_58.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_58,&local_64);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}